

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O2

int Gem_ManFree(Gem_Man_t *p)

{
  word *__ptr;
  Vec_Mem_t *pVVar1;
  int i;
  long lVar2;
  
  pVVar1 = p->vTtMem;
  if (pVVar1 == (Vec_Mem_t *)0x0) {
    pVVar1 = (Vec_Mem_t *)0x0;
  }
  else {
    Vec_IntFreeP(&pVVar1->vTable);
    Vec_IntFreeP(&pVVar1->vNexts);
    pVVar1 = p->vTtMem;
  }
  for (lVar2 = 0; lVar2 <= pVVar1->iPage; lVar2 = lVar2 + 1) {
    __ptr = pVVar1->ppPages[lVar2];
    if (__ptr != (word *)0x0) {
      free(__ptr);
      pVVar1->ppPages[lVar2] = (word *)0x0;
    }
  }
  free(pVVar1->ppPages);
  free(pVVar1);
  if (p->pTtElems != (word **)0x0) {
    free(p->pTtElems);
    p->pTtElems = (word **)0x0;
  }
  free(p->pObjs);
  free(p);
  return 1;
}

Assistant:

int Gem_ManFree( Gem_Man_t * p )
{
    Vec_MemHashFree( p->vTtMem );
    Vec_MemFree( p->vTtMem );
    ABC_FREE( p->pTtElems );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
    return 1;
}